

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

string_view __thiscall
libtorrent::bdecode_node::dict_find_string_value
          (bdecode_node *this,string_view key,string_view default_value)

{
  type_t tVar1;
  undefined1 local_80 [8];
  bdecode_node n;
  bdecode_node *this_local;
  string_view default_value_local;
  string_view key_local;
  
  n._56_8_ = this;
  dict_find((bdecode_node *)local_80,this,key);
  tVar1 = type((bdecode_node *)local_80);
  if (tVar1 == string_t) {
    default_value = string_value((bdecode_node *)local_80);
  }
  ~bdecode_node((bdecode_node *)local_80);
  return default_value;
}

Assistant:

string_view bdecode_node::dict_find_string_value(string_view key
		, string_view default_value) const
	{
		bdecode_node n = dict_find(key);
		if (n.type() != bdecode_node::string_t) return default_value;
		return n.string_value();
	}